

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator+
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,
          ChebyshevExpansion *ce2)

{
  ulong uVar1;
  double dVar2;
  Index size;
  double *pdVar3;
  undefined8 *puVar4;
  ActualDstType actualDst;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  VectorXd c;
  vectype local_68;
  vectype local_58;
  ChebyshevExpansion *local_48;
  ChebyshevExpansion *local_40;
  
  uVar1 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar5 = (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  local_40 = this;
  if (uVar1 == uVar5) {
    local_48 = ce2;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_68,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_48);
    ChebyshevExpansion(__return_storage_ptr__,&local_68,this->m_xmin,this->m_xmax);
  }
  else {
    if ((long)uVar5 < (long)uVar1) {
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if ((long)uVar1 < 0) {
LAB_0012e3d5:
        local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
        ;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)0x0;
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      pdVar3 = local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (uVar1 != 0) {
        free((void *)0x0);
        if (uVar1 == 0) {
          local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)0x0;
          pdVar3 = local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data;
        }
        else {
          if (uVar1 >> 0x3d != 0) {
LAB_0012e451:
            puVar4 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar4 = std::random_device::_M_fini;
            __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pdVar3 = (double *)malloc(uVar1 * 8);
          if (uVar1 != 1 && ((ulong)pdVar3 & 0xf) != 0) {
LAB_0012e47f:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                          ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pdVar3 == (double *)0x0) goto LAB_0012e451;
        }
      }
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar3;
      pdVar3 = local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar1;
      if (1 < (long)uVar1) {
        memset(local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data,0,(uVar1 & 0x7ffffffffffffffe) * 8);
      }
      if ((long)(uVar1 & 0x7ffffffffffffffe) < (long)uVar1) {
        memset((void *)((long)pdVar3 + (uVar1 << 3 & 0xfffffffffffffff0)),0,
               (ulong)((uint)(uVar1 << 3) & 8));
      }
      uVar1 = (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      if ((long)uVar1 < 0 &&
          local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          != (double *)0x0) {
LAB_0012e3f4:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                     );
      }
      if (((long)uVar1 < 0) ||
         (local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          (long)uVar1)) {
LAB_0012e413:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar5 = uVar1;
      if ((((ulong)local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data & 7) == 0) &&
         (uVar5 = (ulong)((uint)((ulong)local_68.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data >> 3) & 1), (long)uVar1 <= (long)uVar5)) {
        uVar5 = uVar1;
      }
      pdVar3 = (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      lVar6 = uVar1 - uVar5;
      if (0 < (long)uVar5) {
        uVar7 = 0;
        do {
          local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar7] = pdVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      uVar7 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + uVar5;
      if (1 < lVar6) {
        do {
          dVar2 = (pdVar3 + uVar5)[1];
          local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar5] = pdVar3[uVar5];
          (local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          + uVar5)[1] = dVar2;
          uVar5 = uVar5 + 2;
        } while ((long)uVar5 < (long)uVar7);
      }
      if ((long)uVar7 < (long)uVar1) {
        do {
          local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar7] = pdVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      if (local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows) {
LAB_0012e432:
        local_48 = (ChebyshevExpansion *)&local_68;
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseBinaryOp.h"
                      ,0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      local_48 = (ChebyshevExpansion *)&local_68;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_58,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_48);
      ChebyshevExpansion(__return_storage_ptr__,&local_58,this->m_xmin,this->m_xmax);
    }
    else {
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if ((long)uVar5 < 0) goto LAB_0012e3d5;
      pdVar3 = local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (uVar5 != 0) {
        free((void *)0x0);
        if (uVar5 == 0) {
          local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)0x0;
          pdVar3 = local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data;
        }
        else {
          if (uVar5 >> 0x3d != 0) {
LAB_0012e49e:
            puVar4 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar4 = std::random_device::_M_fini;
            __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pdVar3 = (double *)malloc(uVar5 * 8);
          if (uVar5 != 1 && ((ulong)pdVar3 & 0xf) != 0) goto LAB_0012e47f;
          if (pdVar3 == (double *)0x0) goto LAB_0012e49e;
        }
      }
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar3;
      pdVar3 = local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar5;
      if (1 < (long)uVar5) {
        memset(local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data,0,(uVar5 & 0x7ffffffffffffffe) * 8);
      }
      if ((long)(uVar5 & 0x7ffffffffffffffe) < (long)uVar5) {
        memset((void *)((long)pdVar3 + (uVar5 << 3 & 0xfffffffffffffff0)),0,
               (ulong)((uint)(uVar5 << 3) & 8));
      }
      uVar1 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      if ((long)uVar1 < 0 &&
          local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          != (double *)0x0) goto LAB_0012e3f4;
      if (((long)uVar1 < 0) ||
         (local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          (long)uVar1)) goto LAB_0012e413;
      uVar5 = uVar1;
      if ((((ulong)local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data & 7) == 0) &&
         (uVar5 = (ulong)((uint)((ulong)local_68.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data >> 3) & 1), (long)uVar1 <= (long)uVar5)) {
        uVar5 = uVar1;
      }
      pdVar3 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      lVar6 = uVar1 - uVar5;
      if (0 < (long)uVar5) {
        uVar7 = 0;
        do {
          local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar7] = pdVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      uVar7 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + uVar5;
      if (1 < lVar6) {
        do {
          dVar2 = (pdVar3 + uVar5)[1];
          local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar5] = pdVar3[uVar5];
          (local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          + uVar5)[1] = dVar2;
          uVar5 = uVar5 + 2;
        } while ((long)uVar5 < (long)uVar7);
      }
      if ((long)uVar7 < (long)uVar1) {
        do {
          local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar7] = pdVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      local_40 = ce2;
      if (local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows) goto LAB_0012e432;
      local_48 = (ChebyshevExpansion *)&local_68;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_58,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_48);
      ChebyshevExpansion(__return_storage_ptr__,&local_58,this->m_xmin,this->m_xmax);
    }
    free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  free(local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::operator+(const ChebyshevExpansion &ce2) const {
        if (m_c.size() == ce2.coef().size()) {
            // Both are the same size, nothing creative to do, just add the coefficients
            return ChebyshevExpansion(std::move(ce2.coef() + m_c), m_xmin, m_xmax);
        }
        else{
            if (m_c.size() > ce2.coef().size()) {
                Eigen::VectorXd c(m_c.size()); c.setZero(); c.head(ce2.coef().size()) = ce2.coef();
                return ChebyshevExpansion(c+m_c, m_xmin, m_xmax);
            }
            else {
                std::size_t n = ce2.coef().size();
                Eigen::VectorXd c(n); c.setZero(); c.head(m_c.size()) = m_c;
                return ChebyshevExpansion(c + ce2.coef(), m_xmin, m_xmax);
            }
        }
    }